

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::Variable::serialize(Variable *this,JSONWriter *w)

{
  pointer pcVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  JSONWriter *pJVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  undefined1 *puVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string __str;
  long local_48;
  char local_31;
  
  local_31 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&(w->s_).field_0x10,&local_31,1);
  name._M_str = "name";
  name._M_len = 4;
  pJVar4 = JSONWriter::key(w,name);
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (this->name)._M_string_length);
  pJVar4 = JSONWriter::value<std::__cxx11::string>(pJVar4,&local_98);
  name_00._M_str = "value";
  name_00._M_len = 5;
  pJVar4 = JSONWriter::key(pJVar4,name_00);
  pcVar1 = (this->value)._M_dataplus._M_p;
  __str.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&__str.field_2 + 8),pcVar1,pcVar1 + (this->value)._M_string_length);
  pJVar4 = JSONWriter::value<std::__cxx11::string>
                     (pJVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&__str.field_2 + 8));
  name_01._M_str = "rtl";
  name_01._M_len = 3;
  pJVar4 = JSONWriter::key(pJVar4,name_01);
  puVar8 = &(pJVar4->s_).field_0x10;
  pcVar7 = "false";
  if ((ulong)this->rtl != 0) {
    pcVar7 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar8,pcVar7,(ulong)this->rtl ^ 5);
  local_31 = ',';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar8,&local_31,1);
  if ((long *)__str.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)__str.field_2._8_8_,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((this->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    name_02._M_str = "id";
    name_02._M_len = 2;
    pJVar4 = JSONWriter::key(w,name_02);
    __val = (this->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    cVar6 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar3 = '\x04';
      do {
        cVar6 = cVar3;
        if (uVar5 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001b0f99;
        }
        if (uVar5 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001b0f99;
        }
        if (uVar5 < 10000) goto LAB_001b0f99;
        bVar2 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar3 = cVar6 + '\x04';
      } while (bVar2);
      cVar6 = cVar6 + '\x01';
    }
LAB_001b0f99:
    local_78 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)local_78,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_78,(uint)__str._M_dataplus._M_p,__val);
    JSONWriter::value<std::__cxx11::string>
              (pJVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78)
    ;
    if (local_78 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_78,__str._M_string_length + 1);
    }
  }
  JSONWriter::end_obj(w);
  return;
}

Assistant:

void serialize(JSONWriter &w) const {
        w.begin_obj().key("name").value(name).key("value").value(value).key("rtl").value(rtl);
        if (id) {
            w.key("id").value(std::to_string(*id));
        }
        w.end_obj();
    }